

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_wait_eof(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  char *errmsg;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  do {
    if (channel->wait_eof_state == libssh2_NB_state_idle) {
      channel->wait_eof_state = libssh2_NB_state_created;
    }
    session = channel->session;
    do {
      if ((channel->remote).eof != '\0') {
        channel->wait_eof_state = libssh2_NB_state_idle;
        return 0;
      }
      if ((channel->read_avail == (ulong)(channel->remote).window_size) &&
         (session->api_block_mode != 0)) {
        iVar1 = -0x2f;
        errmsg = "Receiving channel window has been exhausted";
        goto LAB_0010e16b;
      }
      iVar1 = _libssh2_transport_read(session);
      if (iVar1 == -0x25) goto LAB_0010e175;
    } while (-1 < iVar1);
    channel->wait_eof_state = libssh2_NB_state_idle;
    errmsg = "_libssh2_transport_read() bailed out!";
LAB_0010e16b:
    iVar1 = _libssh2_error(session,iVar1,errmsg);
    if (iVar1 != -0x25) {
      return iVar1;
    }
LAB_0010e175:
    if (channel->session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(channel->session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while( true );
}

Assistant:

static int channel_wait_eof(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    int rc;

    if(channel->wait_eof_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Awaiting EOF for channel %lu/%lu", channel->local.id,
                       channel->remote.id));

        channel->wait_eof_state = libssh2_NB_state_created;
    }

    /*
     * While channel is not eof, read more packets from the network.
     * Either the EOF will be set or network timeout will occur.
     */
    do {
        if(channel->remote.eof) {
            break;
        }

        if((channel->remote.window_size == channel->read_avail) &&
            session->api_block_mode)
            return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_WINDOW_FULL,
                                  "Receiving channel window "
                                  "has been exhausted");

        rc = _libssh2_transport_read(session);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc < 0) {
            channel->wait_eof_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "_libssh2_transport_read() bailed out!");
        }
    } while(1);

    channel->wait_eof_state = libssh2_NB_state_idle;

    return 0;
}